

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O2

ssize_t __thiscall
apngasm::spec::priv::JSONSpecReaderImpl::read
          (JSONSpecReaderImpl *this,int __fd,void *__buf,size_t __nbytes)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  optional<bool> oVar6;
  int iVar7;
  reference_type pbVar8;
  reference_type puVar9;
  reference_type pbVar10;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pbVar11;
  Delay DVar12;
  undefined8 extraout_RAX;
  int iVar13;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  ulong uVar15;
  undefined4 in_register_00000034;
  Delay defaultDelay;
  Delay delay;
  int local_174;
  Delay delay_1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  child_1;
  vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_> delays;
  ptree root;
  string file;
  path currentPath;
  path oldPath;
  path local_58;
  
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::basic_ptree(&root);
  std::locale::locale((locale *)&delay);
  boost::property_tree::json_parser::
  read_json<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            ((string *)CONCAT44(in_register_00000034,__fd),&root,(locale *)&delay);
  std::locale::~locale((locale *)&delay);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&currentPath,(string *)CONCAT44(in_register_00000034,__fd),auto_format);
  cVar4 = std::filesystem::__cxx11::path::has_parent_path();
  if (cVar4 != '\0') {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::current_path((path *)&delay);
    std::filesystem::__cxx11::path::~path((path *)&delay);
  }
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&delay,"name",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&value,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                     *)&root,(path_type *)&delay);
  std::__cxx11::string::~string((string *)&delay);
  if (value.super_type.m_initialized == true) {
    pbVar8 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get(&value);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&(this->super_AbstractSpecReaderImpl)._name,pbVar8);
  }
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&value.super_type);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&delay,"loops",0x2e);
  value.super_type._0_8_ =
       boost::property_tree::
       basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::get_optional<unsigned_int>(&root,(path_type *)&delay);
  std::__cxx11::string::~string((string *)&delay);
  if (value.super_type.m_initialized == true) {
    puVar9 = boost::optional<unsigned_int>::get((optional<unsigned_int> *)&value);
    (this->super_AbstractSpecReaderImpl)._loops = *puVar9;
  }
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&delay,"skip_first",0x2e);
  oVar6 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<bool>(&root,(path_type *)&delay);
  value.super_type.m_initialized = oVar6.super_type.m_initialized;
  value.super_type._1_1_ = oVar6.super_type.m_storage;
  std::__cxx11::string::~string((string *)&delay);
  if (value.super_type.m_initialized == true) {
    pbVar10 = boost::optional<bool>::get((optional<bool> *)&value);
    (this->super_AbstractSpecReaderImpl)._skipFirst = *pbVar10;
  }
  defaultDelay.num = 100;
  defaultDelay.den = 1000;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&delay,"default_delay",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&value,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                     *)&root,(path_type *)&delay);
  std::__cxx11::string::~string((string *)&delay);
  if (value.super_type.m_initialized == true) {
    pbVar8 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get(&value);
    bVar5 = anon_unknown_0::str2delay(pbVar8,&defaultDelay);
    if (!bVar5) {
      defaultDelay.num = 100;
      defaultDelay.den = 1000;
    }
  }
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&value.super_type);
  delays.super__Vector_base<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  delays.super__Vector_base<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  delays.super__Vector_base<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&delay,"delays",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_child_optional
            ((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&value,(path_type *)&root);
  std::__cxx11::string::~string((string *)&delay);
  if (value.super_type._0_8_ != 0) {
    pbVar11 = boost::
              optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
              ::get((optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                     *)&value);
    lVar2 = *(long *)((long)pbVar11->m_children + 8);
    lVar14 = lVar2;
    while( true ) {
      plVar1 = (long *)(lVar14 + 0x68);
      lVar14 = *plVar1 + -0x60;
      if (*plVar1 == 0) {
        lVar14 = 0;
      }
      if (lVar14 == lVar2) break;
      bVar5 = anon_unknown_0::str2delay((string *)(lVar14 + 0x20),&delay);
      if (!bVar5) {
        delay = defaultDelay;
      }
      std::vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>::
      push_back(&delays,(value_type *)&delay);
    }
  }
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&delay,"frames",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_child_optional
            ((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&child_1,(path_type *)&root);
  std::__cxx11::string::~string((string *)&delay);
  if (child_1.ptr_ ==
      (basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
LAB_0016bccb:
    std::filesystem::current_path(&oldPath);
    std::_Vector_base<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>::
    ~_Vector_base(&delays.
                   super__Vector_base<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
                 );
    std::filesystem::__cxx11::path::~path(&currentPath);
    std::filesystem::__cxx11::path::~path(&oldPath);
    boost::property_tree::
    basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~basic_ptree(&root);
    return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  pbVar11 = boost::
            optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
            ::get(&child_1);
  lVar2 = *(long *)((long)pbVar11->m_children + 8);
  lVar3 = *(long *)(lVar2 + 0x68);
  lVar14 = lVar3 + -0x60;
  if (lVar3 == 0) {
    lVar14 = 0;
  }
  bVar5 = true;
  local_174 = 0;
  do {
    iVar13 = local_174;
    do {
      local_174 = local_174 + 1;
      if ((!bVar5) || (lVar14 == lVar2)) goto LAB_0016bccb;
      iVar7 = iVar13 + 1;
      bVar5 = false;
      for (uVar15 = (ulong)iVar13; (long)local_174 != uVar15; uVar15 = uVar15 + 1) {
        file._M_dataplus._M_p = (pointer)&file.field_2;
        file._M_string_length = 0;
        file.field_2._M_local_buf[0] = '\0';
        if (*(long *)(*(long *)(lVar14 + 0x40) + 0x18) == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&file,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (lVar14 + 0x20));
          DVar12 = defaultDelay;
          if (uVar15 < (ulong)((long)delays.
                                     super__Vector_base<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)delays.
                                     super__Vector_base<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3)) {
            DVar12 = *(Delay *)(delays.
                                super__Vector_base<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar15);
          }
LAB_0016bc3a:
          delay_1 = DVar12;
        }
        else {
          lVar3 = *(long *)(*(long *)(*(long *)(lVar14 + 0x40) + 8) + 0x68);
          __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (lVar3 + -0x60);
          if (lVar3 == 0) {
            __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&file,__str);
          bVar5 = anon_unknown_0::str2delay(__str + 1,&delay_1);
          DVar12 = defaultDelay;
          if (!bVar5) goto LAB_0016bc3a;
        }
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_58,&file,auto_format);
        std::filesystem::absolute((path *)&value);
        std::filesystem::__cxx11::path::string((string *)&delay,(path *)&value);
        std::filesystem::__cxx11::path::~path((path *)&value);
        std::filesystem::__cxx11::path::~path(&local_58);
        std::vector<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
        ::push_back(&(this->super_AbstractSpecReaderImpl)._frameInfos,(value_type *)&delay);
        std::__cxx11::string::~string((string *)&delay);
        std::__cxx11::string::~string((string *)&file);
        bVar5 = true;
      }
      iVar13 = iVar7;
    } while (!bVar5);
    plVar1 = (long *)(lVar14 + 0x68);
    lVar14 = *plVar1 + -0x60;
    local_174 = iVar7;
    if (*plVar1 == 0) {
      lVar14 = 0;
    }
  } while( true );
}

Assistant:

bool JSONSpecReaderImpl::read(const std::string& filePath)
      {
        // Read JSON file.
        boost::property_tree::ptree root;
        boost::property_tree::read_json(filePath, root);

        // Set current directory.
        const std::filesystem::path oldPath = std::filesystem::current_path();
        const std::filesystem::path currentPath = std::filesystem::path(filePath);
        if(currentPath.has_parent_path())
          std::filesystem::current_path(currentPath.parent_path());

        // Read fields.
        // name
        if( boost::optional<std::string> value = root.get_optional<std::string>("name") )
        {
          _name = value.get();
        }

        // loops
        if( boost::optional<unsigned int> value = root.get_optional<unsigned int>("loops") )
        {
          _loops = value.get();
        }

        // skip_first
        if( boost::optional<bool> value = root.get_optional<bool>("skip_first") )
        {
          _skipFirst = value.get();
        }

        // delay
        Delay defaultDelay = { DEFAULT_FRAME_NUMERATOR, DEFAULT_FRAME_DENOMINATOR };
        if( boost::optional<std::string> value = root.get_optional<std::string>("default_delay") )
        {
          if( !str2delay(value.get(), &defaultDelay) )
          {
            defaultDelay.num = DEFAULT_FRAME_NUMERATOR;
            defaultDelay.den = DEFAULT_FRAME_DENOMINATOR;
          }
        }

        std::vector<Delay> delays;
        if( boost::optional<boost::property_tree::ptree&> child = root.get_child_optional("delays") )
        {
          BOOST_FOREACH(const boost::property_tree::ptree::value_type& current, child.get())
          {
            Delay delay;
            if( !str2delay(current.second.data(), &delay) )
              delay = defaultDelay;
            delays.push_back(delay);
          }
        }

        // frames
        if( boost::optional<boost::property_tree::ptree&> child = root.get_child_optional("frames") )
        {
          int delayIndex = 0;
          BOOST_FOREACH(const boost::property_tree::ptree::value_type& current, child.get())
          {
            std::string file;
            Delay delay;
            const boost::property_tree::ptree& frame = current.second;

            // filepath only.
            if(frame.empty())
            {
              file = frame.data();
              if(delayIndex < delays.size())
                delay = delays[delayIndex];
              else
                delay = defaultDelay;
            }

            // filepath and delay
            else
            {
              const boost::property_tree::ptree::value_type& value = frame.front();
              file = value.first;
              if( !str2delay(value.second.data(), &delay) )
                delay = defaultDelay;
            }

            // Add frame informations.
            const FrameInfo frameInfo = { std::filesystem::absolute(file).string(), delay };
            _frameInfos.push_back(frameInfo);

            ++delayIndex;
          }
        }

        // Reset current directory.
        std::filesystem::current_path(oldPath);

        return true;
      }